

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O0

bool dxil_spv::emit_coverage_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Id IVar2;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  Operation *load_op;
  Operation *ptr_op;
  Id var_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  IVar1 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInSampleMask);
  IVar2 = spv::Builder::makeUintType(this,0x20);
  IVar2 = spv::Builder::makePointer(this,StorageClassInput,IVar2);
  this_00 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
  Operation::add_id(this_00,IVar1);
  IVar1 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
  Operation::add_id(this_01,this_00->id);
  Converter::Impl::add(impl,this_01,false);
  return true;
}

Assistant:

bool emit_coverage_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSampleMask);

	Operation *ptr_op =
	    impl.allocate(spv::OpAccessChain, builder.makePointer(spv::StorageClassInput, builder.makeUintType(32)));
	ptr_op->add_id(var_id);
	ptr_op->add_id(builder.makeUintConstant(0));
	impl.add(ptr_op);

	Operation *load_op = impl.allocate(spv::OpLoad, instruction);
	load_op->add_id(ptr_op->id);
	impl.add(load_op);
	return true;
}